

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O1

void vkt::anon_unknown_0::genUniformBlock
               (ostringstream *out,string *blockName,string *instanceName,int setNdx,int bindingNdx,
               vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *uniforms)

{
  long *plVar1;
  ostream *poVar2;
  undefined4 in_register_00000084;
  VarType *varType_;
  DeclareVariable local_70;
  
  plVar1 = (long *)CONCAT44(in_register_00000084,bindingNdx);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"layout(",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"binding = ",10);
  poVar2 = (ostream *)std::ostream::operator<<(out,setNdx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", std140) uniform ",0x12);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(blockName->_M_dataplus)._M_p,blockName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  varType_ = (VarType *)*plVar1;
  if (varType_ != (VarType *)plVar1[1]) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\t",1);
      glu::decl::DeclareVariable::DeclareVariable(&local_70,varType_,(string *)(varType_ + 1),1);
      poVar2 = glu::decl::operator<<((ostream *)out,&local_70);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
        operator_delete(local_70.name._M_dataplus._M_p,
                        local_70.name.field_2._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_70.varType);
      varType_ = (VarType *)&varType_[3].m_data;
    } while (varType_ != (VarType *)plVar1[1]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"}",1);
  if (instanceName->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,(instanceName->_M_dataplus)._M_p,instanceName->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,";\n",2);
  return;
}

Assistant:

void genUniformBlock (ostringstream& out, const string& blockName, const string& instanceName, int setNdx, int bindingNdx, const vector<Value>& uniforms)
{
	out << "layout(";

	if (setNdx != 0)
		out << "set = " << setNdx << ", ";

	out << "binding = " << bindingNdx << ", std140) uniform " << blockName << "\n"
		<< "{\n";

	for (vector<Value>::const_iterator val = uniforms.begin(); val != uniforms.end(); ++val)
		out << "\t" << glu::declare(val->type, val->name, 1) << ";\n";

	out << "}";

	if (!instanceName.empty())
		out << " " << instanceName;

	out << ";\n";
}